

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O3

int __thiscall Fl_Input::handle_key(Fl_Input *this)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined8 in_RAX;
  char *pcVar6;
  lconv *plVar7;
  size_t sVar8;
  int extraout_EDX;
  int __c;
  int __c_00;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int iVar9;
  uint uVar10;
  long lVar11;
  char ascii;
  int del;
  char local_25;
  int local_24;
  
  bVar1 = *Fl::e_text;
  local_24 = (int)((ulong)in_RAX >> 0x20);
  iVar4 = Fl::compose(&local_24);
  if (iVar4 != 0) {
    bVar2 = (this->super_Fl_Input_).super_Fl_Widget.type_;
    if ((bVar2 & 7) - 1 < 2) {
      Fl::compose_reset();
      iVar4 = extraout_EDX;
      if (legal_fp_chars == (char *)0x0) {
        plVar7 = localeconv();
        if (plVar7 == (lconv *)0x0) {
          lVar11 = 5;
        }
        else {
          if (plVar7->decimal_point == (char *)0x0) {
            lVar11 = 5;
          }
          else {
            sVar8 = strlen(plVar7->decimal_point);
            lVar11 = sVar8 + 5;
          }
          if (plVar7->mon_decimal_point != (char *)0x0) {
            sVar8 = strlen(plVar7->mon_decimal_point);
            lVar11 = lVar11 + sVar8;
          }
          if (plVar7->positive_sign != (char *)0x0) {
            sVar8 = strlen(plVar7->positive_sign);
            lVar11 = lVar11 + sVar8;
          }
          if (plVar7->negative_sign != (char *)0x0) {
            sVar8 = strlen(plVar7->negative_sign);
            lVar11 = lVar11 + sVar8;
          }
        }
        pcVar6 = (char *)malloc(lVar11 + 1);
        legal_fp_chars = pcVar6;
        builtin_strncpy(pcVar6,".eE+-",6);
        iVar4 = extraout_EDX_00;
        if (plVar7 != (lconv *)0x0) {
          if (plVar7->decimal_point != (char *)0x0) {
            strcat(pcVar6,plVar7->decimal_point);
            iVar4 = extraout_EDX_01;
          }
          if (plVar7->mon_decimal_point != (char *)0x0) {
            strcat(pcVar6,plVar7->mon_decimal_point);
            iVar4 = extraout_EDX_02;
          }
          if (plVar7->positive_sign != (char *)0x0) {
            strcat(pcVar6,plVar7->positive_sign);
            iVar4 = extraout_EDX_03;
          }
          if (plVar7->negative_sign != (char *)0x0) {
            strcat(pcVar6,plVar7->negative_sign);
            iVar4 = extraout_EDX_04;
          }
        }
      }
      iVar9 = (this->super_Fl_Input_).position_;
      iVar3 = (this->super_Fl_Input_).mark_;
      if (iVar9 < iVar3) {
        iVar3 = iVar9;
      }
      if (iVar3 == 0) {
        if (((bVar1 != 0x2b) && (bVar1 != 0x2d)) && (9 < (byte)(bVar1 - 0x30))) goto LAB_001b95e3;
      }
      else if (9 < (byte)(bVar1 - 0x30)) {
        if (iVar3 == 1) {
          pcVar6 = Fl_Input_::index(&this->super_Fl_Input_,(char *)0x0,iVar4);
          if (((int)pcVar6 != 0x30) || ((bVar1 & 0xdf) != 0x58)) {
LAB_001b95e3:
            if (bVar1 == 0 || ((this->super_Fl_Input_).super_Fl_Widget.type_ & 7) != 1) {
              return 1;
            }
            pcVar6 = strchr(legal_fp_chars,(int)(char)bVar1);
            if (pcVar6 == (char *)0x0) {
              return 1;
            }
          }
        }
        else if ((((iVar3 < 2) ||
                  (pcVar6 = Fl_Input_::index(&this->super_Fl_Input_,(char *)0x0,iVar4),
                  (int)pcVar6 != 0x30)) ||
                 ((pcVar6 = Fl_Input_::index(&this->super_Fl_Input_,&DAT_00000001,__c),
                  (int)pcVar6 != 0x78 &&
                  (pcVar6 = Fl_Input_::index(&this->super_Fl_Input_,&DAT_00000001,__c_00),
                  (int)pcVar6 != 0x58)))) ||
                ((0x25 < bVar1 - 0x41 ||
                 ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) == 0)))) goto LAB_001b95e3;
      }
      if (((this->super_Fl_Input_).super_Fl_Widget.type_ & 8) == 0) {
        Fl_Input_::replace(&this->super_Fl_Input_,(this->super_Fl_Input_).position_,
                           (this->super_Fl_Input_).mark_,&local_25,1);
        return 1;
      }
    }
    else if (local_24 == 0) {
      if (Fl::e_length == 0) {
        return 1;
      }
      if ((bVar2 & 8) == 0) {
        iVar4 = (this->super_Fl_Input_).position_;
        local_24 = (this->super_Fl_Input_).mark_;
        goto LAB_001b9548;
      }
    }
    else if ((bVar2 & 8) == 0) {
      iVar4 = (this->super_Fl_Input_).position_;
      local_24 = iVar4 - local_24;
LAB_001b9548:
      Fl_Input_::replace(&this->super_Fl_Input_,iVar4,local_24,Fl::e_text,Fl::e_length);
      return 1;
    }
    goto LAB_001b99d8;
  }
  uVar5 = Fl::e_state & 0x4c0000;
  bVar2 = (this->super_Fl_Input_).super_Fl_Widget.type_;
  if (Fl::e_keysym < 0xff50) {
    if (Fl::e_keysym < 0x7a) {
      if (Fl::e_keysym < 0x76) {
        if (Fl::e_keysym == 0x61) {
          if (uVar5 == 0x40000) {
            uVar5 = (this->super_Fl_Input_).size_;
            goto LAB_001b9a5b;
          }
        }
        else if ((Fl::e_keysym == 99) && (uVar10 = Fl::e_state, uVar5 == 0x40000))
        goto LAB_001b9a13;
      }
      else if (Fl::e_keysym == 0x76) {
        if (uVar5 == 0x40000) goto LAB_001b995e;
      }
      else if ((Fl::e_keysym == 0x78) && (uVar5 == 0x40000)) goto LAB_001b96e4;
      goto switchD_001b944e_caseD_ff58;
    }
    if (0xff08 < Fl::e_keysym) {
      if (Fl::e_keysym == 0xff09) {
        if ((Fl::e_state & 0x4d0000U) != 0) {
          return 0;
        }
        if ((char)(bVar2 & 7) != '\x04') {
          return 0;
        }
        if ((this->super_Fl_Input_).tab_nav_ != 0) {
          return 0;
        }
      }
      else if (Fl::e_keysym == 0xff0d) goto LAB_001b9709;
      goto switchD_001b944e_caseD_ff58;
    }
    if (Fl::e_keysym == 0x7a) {
      if ((Fl::e_state & 0x4d0000U) == 0x50000) {
        iVar4 = kf_redo(this);
        return iVar4;
      }
      if ((Fl::e_state & 0x4d0000U) == 0x40000) {
        iVar4 = kf_undo(this);
        return iVar4;
      }
      goto switchD_001b944e_caseD_ff58;
    }
    if (Fl::e_keysym != 0xff08) goto switchD_001b944e_caseD_ff58;
    if (uVar5 == 0x40000) {
      iVar4 = kf_delete_word_left(this);
      return iVar4;
    }
    if (uVar5 != 0) {
      return 0;
    }
    goto LAB_001b9a09;
  }
  switch(Fl::e_keysym) {
  case 0xff50:
    if (uVar5 != 0x40000) {
      if (uVar5 != 0) {
        return 0;
      }
      iVar4 = kf_move_sol(this);
      return iVar4;
    }
    uVar5 = (Fl::e_state << 0xf) >> 0x1f & (this->super_Fl_Input_).mark_;
LAB_001b9a5b:
    uVar10 = 0;
LAB_001b9a60:
    Fl_Input_::position(&this->super_Fl_Input_,uVar10,uVar5);
    return 1;
  case 0xff51:
    if (uVar5 != 0x400000) {
      if (uVar5 == 0x40000) {
        kf_move_word_left(this);
        return 1;
      }
      if (uVar5 != 0) {
        return 0;
      }
    }
    iVar4 = kf_move_char_left(this);
    return iVar4;
  case 0xff52:
    if (uVar5 == 0x40000) {
      iVar4 = kf_move_up_and_sol(this);
      return iVar4;
    }
    if (uVar5 == 0) {
      iVar4 = 1;
LAB_001b990d:
      iVar4 = kf_lines_up(this,iVar4);
      return iVar4;
    }
    break;
  case 0xff53:
    if (uVar5 != 0x400000) {
      if (uVar5 == 0x40000) {
        kf_move_word_right(this);
        return 1;
      }
      if (uVar5 != 0) {
        return 0;
      }
    }
    iVar4 = kf_move_char_right(this);
    return iVar4;
  case 0xff54:
    if (uVar5 == 0x40000) {
      iVar4 = kf_move_down_and_eol(this);
      return iVar4;
    }
    if (uVar5 == 0) {
      iVar4 = 1;
LAB_001b9885:
      iVar4 = kf_lines_down(this,iVar4);
      return iVar4;
    }
    break;
  case 0xff55:
    if (((uVar5 == 0x80000) || (uVar5 == 0x40000)) || (uVar5 == 0)) {
      iVar4 = Fl_Input_::linesPerPage(&this->super_Fl_Input_);
      goto LAB_001b990d;
    }
    break;
  case 0xff56:
    if (((uVar5 == 0x80000) || (uVar5 == 0x40000)) || (uVar5 == 0)) {
      iVar4 = Fl_Input_::linesPerPage(&this->super_Fl_Input_);
      goto LAB_001b9885;
    }
    break;
  case 0xff57:
    if (uVar5 != 0x40000) {
      if (uVar5 != 0) {
        return 0;
      }
      iVar4 = kf_move_eol(this);
      return iVar4;
    }
    uVar10 = (this->super_Fl_Input_).size_;
    uVar5 = uVar10;
    if (((uint)Fl::e_state >> 0x10 & 1) != 0) {
      uVar5 = (this->super_Fl_Input_).mark_;
    }
    goto LAB_001b9a60;
  case 0xff63:
    if ((Fl::e_state & 0x4d0000U) != 0x10000) {
      uVar10 = Fl::e_state & 0x4d0000U;
      if (uVar5 != 0x40000) {
        if (uVar5 != 0) {
          return 0;
        }
        if ((bVar2 & 8) != 0) {
          fl_beep(0);
          return 1;
        }
        return 1;
      }
LAB_001b9a13:
      iVar4 = Fl_Input_::copy(&this->super_Fl_Input_,(EVP_PKEY_CTX *)&DAT_00000001,
                              (EVP_PKEY_CTX *)(ulong)uVar10);
      return iVar4;
    }
LAB_001b995e:
    kf_paste(this);
    return 1;
  default:
    if (Fl::e_keysym == 0xff8d) {
LAB_001b9709:
      if (((this->super_Fl_Input_).super_Fl_Widget.when_ & 8) != 0) {
        Fl_Input_::position(&this->super_Fl_Input_,(this->super_Fl_Input_).size_,0);
        Fl_Input_::maybe_do_callback(&this->super_Fl_Input_);
        return 1;
      }
      if ((bVar2 & 0xf) != 4) {
        return 0;
      }
      iVar4 = (this->super_Fl_Input_).position_;
      iVar9 = (this->super_Fl_Input_).mark_;
      pcVar6 = "\n";
      goto LAB_001b99c5;
    }
    if (Fl::e_keysym == 0xffff) {
      iVar4 = (this->super_Fl_Input_).position_;
      iVar9 = (this->super_Fl_Input_).mark_;
      if ((Fl::e_state & 0x4d0000U) != 0x10000 || iVar4 == iVar9) {
        if (iVar4 != iVar9 || (Fl::e_state & 0x4d0000U) != 0x10000) {
          if (uVar5 == 0x40000) {
            iVar4 = kf_delete_word_right(this);
            return iVar4;
          }
          if (uVar5 != 0) {
            return 0;
          }
        }
        iVar4 = kf_delete_char_right(this);
        return iVar4;
      }
LAB_001b96e4:
      iVar4 = kf_copy_cut(this);
      return iVar4;
    }
  case 0xff58:
  case 0xff59:
  case 0xff5a:
  case 0xff5b:
  case 0xff5c:
  case 0xff5d:
  case 0xff5e:
  case 0xff5f:
  case 0xff60:
  case 0xff61:
  case 0xff62:
switchD_001b944e_caseD_ff58:
    uVar5 = (uint)bVar1;
    if (0xd < uVar5) {
      return 0;
    }
    if ((0x3600U >> (uVar5 & 0x1f) & 1) == 0) {
      if (uVar5 != 8) {
        return 0;
      }
LAB_001b9a09:
      kf_delete_char_left(this);
    }
    else {
      if ((bVar2 & 8) == 0) {
        if ((bVar2 & 7) - 1 < 2) {
          return 0;
        }
        iVar4 = (this->super_Fl_Input_).position_;
        iVar9 = (this->super_Fl_Input_).mark_;
        pcVar6 = &local_25;
LAB_001b99c5:
        iVar4 = Fl_Input_::replace(&this->super_Fl_Input_,iVar4,iVar9,pcVar6,1);
        return iVar4;
      }
LAB_001b99d8:
      fl_beep(0);
    }
    return 1;
  }
  return 0;
}

Assistant:

int Fl_Input::handle_key() {
  
  char ascii = Fl::event_text()[0];
  
  int del;
  if (Fl::compose(del)) {
    
    // Insert characters into numeric fields after checking for legality:
    if (input_type() == FL_FLOAT_INPUT || input_type() == FL_INT_INPUT) {
      Fl::compose_reset(); // ignore any foreign letters...
      
      // initialize the list of legal characters inside a floating point number
#ifdef HAVE_LOCALECONV
      if (!legal_fp_chars) {
        size_t len = strlen(standard_fp_chars);
        struct lconv *lc = localeconv();
        if (lc) {
          if (lc->decimal_point) len += strlen(lc->decimal_point);
          if (lc->mon_decimal_point) len += strlen(lc->mon_decimal_point);
          if (lc->positive_sign) len += strlen(lc->positive_sign);
          if (lc->negative_sign) len += strlen(lc->negative_sign);
        }
        // the following line is not a true memory leak because the array is only
        // allocated once if required, and automatically freed when the program quits
        char *chars = (char*)malloc(len+1);
	legal_fp_chars = chars;
        strcpy(chars, standard_fp_chars);
        if (lc) {
          if (lc->decimal_point) strcat(chars, lc->decimal_point);
          if (lc->mon_decimal_point) strcat(chars, lc->mon_decimal_point);
          if (lc->positive_sign) strcat(chars, lc->positive_sign);
          if (lc->negative_sign) strcat(chars, lc->negative_sign);
        }
      }
#endif // HAVE_LOCALECONV
      
      // find the insert position
      int ip = position()<mark() ? position() : mark();
      // This is complex to allow "0xff12" hex to be typed:
      if (   (!ip && (ascii == '+' || ascii == '-')) 
          || (ascii >= '0' && ascii <= '9') 
          || (ip==1 && index(0)=='0' && (ascii=='x' || ascii == 'X')) 
          || (ip>1 && index(0)=='0' && (index(1)=='x'||index(1)=='X') 
              && ((ascii>='A'&& ascii<='F') || (ascii>='a'&& ascii<='f'))) 
          || (input_type()==FL_FLOAT_INPUT && ascii && strchr(legal_fp_chars, ascii))) 
      {
	if (readonly()) fl_beep();
	else replace(position(), mark(), &ascii, 1);
      }
      return 1;
    }
    
    if (del || Fl::event_length()) {
      if (readonly()) fl_beep();
      else replace(position(), del ? position()-del : mark(),
	           Fl::event_text(), Fl::event_length());
    }
#ifdef __APPLE__
    if (Fl::compose_state) {
      this->mark( this->position() - Fl::compose_state );
      }
#endif
    return 1;
  }
  
  unsigned int mods = Fl::event_state() & (FL_META|FL_CTRL|FL_ALT);
  unsigned int shift = Fl::event_state() & FL_SHIFT;
  unsigned int multiline = (input_type() == FL_MULTILINE_INPUT) ? 1 : 0;
  //
  // The following lists apps that support these keypresses.
  // Prefixes: '!' indicates NOT supported, '?' indicates un-verified.
  //
  //    HIG=Human Interface Guide, 
  //    TE=TextEdit.app, SA=Safari.app, WOX=MS Word/OSX -- OSX 10.4.x
  //    NP=Notepad, WP=WordPad, WOW=MS Word/Windows     -- WinXP
  //    GE=gedit, KE=kedit                              -- Ubuntu8.04
  //    OF=old FLTK behavior (<=1.1.10)
  //
  // Example: (NP,WP,!WO) means supported in notepad + wordpad, but NOT word.
  //
  switch (Fl::event_key()) {

    case FL_Insert:
      // Note: Mac has no "Insert" key; it's the "Help" key.
      //       This keypress is apparently not possible on macs.
      //
      if (mods==0 && shift) return kf_paste();			// Shift-Insert   (WP,NP,WOW,GE,KE,OF)
      if (mods==0)          return kf_insert_toggle();		// Insert         (Standard)
      if (mods==FL_CTRL)    return kf_copy();			// Ctrl-Insert    (WP,NP,WOW,GE,KE,OF)
      return 0;							// ignore other combos, pass to parent

    case FL_Delete: {
#ifdef __APPLE__
      if (mods==0)          return kf_delete_char_right();	// Delete         (OSX-HIG,TE,SA,WOX)
      if (mods==FL_CTRL)    return kf_delete_char_right();	// Ctrl-Delete    (??? TE,!SA,!WOX)
      if (mods==FL_ALT)     return kf_delete_word_right();	// Alt-Delete     (OSX-HIG,TE,SA)
      return 0;							// ignore other combos, pass to parent
#else
      int selected = (position() != mark()) ? 1 : 0;
      if (mods==0 && shift && selected)
                            return kf_copy_cut();		// Shift-Delete with selection (WP,NP,WOW,GE,KE,OF)
      if (mods==0 && shift && !selected)
                            return kf_delete_char_right();	// Shift-Delete no selection (WP,NP,WOW,GE,KE,!OF)
      if (mods==0)          return kf_delete_char_right();	// Delete         (Standard)
      if (mods==FL_CTRL)    return kf_delete_word_right();	// Ctrl-Delete    (WP,!NP,WOW,GE,KE,!OF)
      return 0;							// ignore other combos, pass to parent
#endif
    }

    case FL_Left:
#ifdef __APPLE__
      if (mods==0)          return kf_move_char_left();		// Left           (OSX-HIG)
      if (mods==FL_ALT)     return kf_move_word_left();		// Alt-Left       (OSX-HIG)
      if (mods==FL_META)    return kf_move_sol();		// Meta-Left      (OSX-HIG)
      if (mods==FL_CTRL)    return kf_move_sol();		// Ctrl-Left      (TE/SA)
      return 0;							// ignore other combos, pass to parent
#else
      if (mods==0)          return kf_move_char_left();		// Left           (WP,NP,WOW,GE,KE,OF)
      if (mods==FL_CTRL)    return kf_move_word_left();		// Ctrl-Left      (WP,NP,WOW,GE,KE,!OF)
      if (mods==FL_META)    return kf_move_char_left();		// Meta-Left      (WP,NP,?WOW,GE,KE)
      return 0;							// ignore other combos, pass to parent
#endif

    case FL_Right:
#ifdef __APPLE__
      if (mods==0)          return kf_move_char_right();	// Right          (OSX-HIG)
      if (mods==FL_ALT)     return kf_move_word_right();	// Alt-Right      (OSX-HIG)
      if (mods==FL_META)    return kf_move_eol();		// Meta-Right     (OSX-HIG)
      if (mods==FL_CTRL)    return kf_move_eol();		// Ctrl-Right     (TE/SA)
      return 0;							// ignore other combos, pass to parent
#else
      if (mods==0)          return kf_move_char_right();	// Right          (WP,NP,WOW,GE,KE,OF)
      if (mods==FL_CTRL)    return kf_move_word_right();	// Ctrl-Right     (WP,NP,WOW,GE,KE,!OF)
      if (mods==FL_META)    return kf_move_char_right();	// Meta-Right     (WP,NP,?WOW,GE,KE,!OF)
      return 0;							// ignore other combos, pass to parent
#endif

    case FL_Up:
#ifdef __APPLE__
      if (mods==0)          return kf_lines_up(1);		// Up             (OSX-HIG)
      if (mods==FL_CTRL)    return kf_page_up();		// Ctrl-Up        (TE !HIG)
      if (mods==FL_ALT)     return kf_move_up_and_sol();	// Alt-Up         (OSX-HIG)
      if (mods==FL_META)    return kf_top();			// Meta-Up        (OSX-HIG)
      return 0;							// ignore other combos, pass to parent
#else
      if (mods==0)          return kf_lines_up(1);		// Up             (WP,NP,WOW,GE,KE,OF)
      if (mods==FL_CTRL)    return kf_move_up_and_sol();	// Ctrl-Up        (WP,!NP,WOW,GE,!KE,OF)
      return 0;							// ignore other combos, pass to parent
#endif

    case FL_Down:
#ifdef __APPLE__
      if (mods==0)          return kf_lines_down(1);		// Dn             (OSX-HIG)
      if (mods==FL_CTRL)    return kf_page_down();		// Ctrl-Dn        (TE !HIG)
      if (mods==FL_ALT)     return kf_move_down_and_eol();	// Alt-Dn         (OSX-HIG)
      if (mods==FL_META)    return kf_bottom();			// Meta-Dn        (OSX-HIG)
      return 0;							// ignore other combos, pass to parent
#else
      if (mods==0)          return kf_lines_down(1);		// Dn             (WP,NP,WOW,GE,KE,OF)
      if (mods==FL_CTRL)    return kf_move_down_and_eol();	// Ctrl-Down      (WP,!NP,WOW,GE,!KE,OF)
      return 0;							// ignore other combos, pass to parent
#endif

    case FL_Page_Up:
      // Fl_Input has no scroll control, so instead we move the cursor by one page
      // OSX-HIG recommends Alt increase one semantic unit, Meta next higher..
#ifdef __APPLE__
      if (mods==0)          return kf_page_up();		// PgUp           (OSX-HIG)
      if (mods==FL_ALT)     return kf_page_up();		// Alt-PageUp     (OSX-HIG)
      if (mods==FL_META)    return kf_top();			// Meta-PageUp    (OSX-HIG,!TE)
      return 0;							// ignore other combos, pass to parent
#else
      if (mods==0)          return kf_page_up();		// PageUp         (WP,NP,WOW,GE,KE)
      if (mods==FL_CTRL)    return kf_page_up();		// Ctrl-PageUp    (!WP,!NP,!WOW,!GE,KE,OF)
      if (mods==FL_ALT)     return kf_page_up();		// Alt-PageUp     (!WP,!NP,!WOW,!GE,KE,OF)
      return 0;							// ignore other combos, pass to parent
#endif

    case FL_Page_Down:
#ifdef __APPLE__
      // Fl_Input has no scroll control, so instead we move the cursor by one page
      // OSX-HIG recommends Alt increase one semantic unit, Meta next higher..
      if (mods==0)          return kf_page_down();		// PgDn           (OSX-HIG)
      if (mods==FL_ALT)     return kf_page_down();		// Alt-PageDn     (OSX-HIG)
      if (mods==FL_META)    return kf_bottom();			// Meta-PageDn    (OSX-HIG,!TE)
      return 0;							// ignore other combos, pass to parent
#else
      if (mods==0)          return kf_page_down();		// PageDn         (WP,NP,WOW,GE,KE)
      if (mods==FL_CTRL)    return kf_page_down();		// Ctrl-PageDn    (!WP,!NP,!WOW,!GE,KE,OF)
      if (mods==FL_ALT)     return kf_page_down();		// Alt-PageDn     (!WP,!NP,!WOW,!GE,KE,OF)
      return 0;							// ignore other combos, pass to parent
#endif

    case FL_Home:
#ifdef __APPLE__
      if (mods==0)          return kf_top();			// Home           (OSX-HIG)
      if (mods==FL_ALT)     return kf_top();			// Alt-Home       (???)
      return 0;							// ignore other combos, pass to parent
#else
      if (mods==0)          return kf_move_sol();		// Home           (WP,NP,WOW,GE,KE,OF)
      if (mods==FL_CTRL)    return kf_top();			// Ctrl-Home      (WP,NP,WOW,GE,KE,OF)
      return 0;							// ignore other combos, pass to parent
#endif

    case FL_End:
#ifdef __APPLE__
      if (mods==0)          return kf_bottom();			// End            (OSX-HIG)
      if (mods==FL_ALT)     return kf_bottom();			// Alt-End        (???)
      return 0;							// ignore other combos, pass to parent
#else
      if (mods==0)          return kf_move_eol();		// End            (WP,NP,WOW,GE,KE,OF)
      if (mods==FL_CTRL)    return kf_bottom();			// Ctrl-End       (WP,NP,WOW,GE,KE,OF)
      return 0;							// ignore other combos, pass to parent
#endif

    case FL_BackSpace:
#ifdef __APPLE__
      if (mods==0)          return kf_delete_char_left();	// Backspace      (OSX-HIG)
      if (mods==FL_CTRL)    return kf_delete_char_left();	// Ctrl-Backspace (TE/SA)
      if (mods==FL_ALT)     return kf_delete_word_left();	// Alt-Backspace  (OSX-HIG)
      if (mods==FL_META)    return kf_delete_sol();		// Meta-Backspace (OSX-HIG,!TE)
      return 0;							// ignore other combos, pass to parent
#else
      if (mods==0)          return kf_delete_char_left();	// Backspace      (WP,NP,WOW,GE,KE,OF)
      if (mods==FL_CTRL)    return kf_delete_word_left();	// Ctrl-Backspace (WP,!NP,WOW,GE,KE,!OF)
      return 0;							// ignore other combos, pass to parent
#endif

    case FL_Enter:
    case FL_KP_Enter:
      if (when() & FL_WHEN_ENTER_KEY) {
        position(size(), 0);
        maybe_do_callback();
        return 1;
      } else if (multiline && !readonly()) {
        return replace(position(), mark(), "\n", 1);
      } return 0;			// reserved for shortcuts

    case FL_Tab:
      // Handle special case for multiline input with 'old tab behavior';
      // tab handled as a normal insertable character.
      //
      if (mods==0 && !shift 		// Tab?
	   && !tab_nav()		// old tab behavior enabled?
	   && multiline) {		// multiline input?
        break;				// insert tab character
      }
      if (mods==0) return 0;					// Tab, Shift-Tab? nav focus      (Standard/OSX-HIG)
      return 0;							// ignore other combos, pass to parent

    case 'a':
      if (mods==FL_COMMAND) return kf_select_all();		// Ctrl-A, Mac:Meta-A             (Standard/OSX-HIG)
      break;							// handle other combos elsewhere
    case 'c':
      if (mods==FL_COMMAND) return kf_copy();			// Ctrl-C, Mac:Meta-C             (Standard/OSX-HIG)
      break;							// handle other combos elsewhere
    case 'v':
      if (mods==FL_COMMAND) return kf_paste();			// Ctrl-V, Mac:Meta-V             (Standard/OSX-HIG)
      break;							// handle other combos elsewhere
    case 'x':
      if (mods==FL_COMMAND) return kf_copy_cut();		// Ctrl-X, Mac:Meta-X             (Standard/OSX-HIG)
      break;
    case 'z':
      if (mods==FL_COMMAND && !shift) return kf_undo();		// Ctrl-Z, Mac:Meta-Z             (Standard/OSX-HIG)
      if (mods==FL_COMMAND && shift)  return kf_redo();		// Shift-Ctrl-Z, Mac:Shift-Meta-Z (Standard/OSX-HIG)
      break;							// handle other combos elsewhere
  }
  
  switch (ascii) {
    case ctrl('H'):
      return kf_delete_char_left();				// Ctrl-H                           (!WP,!NP,!WOW,!WOX,TE,SA,GE,KE,OF)
    case ctrl('I'): 						// Ctrl-I (literal Tab)             (!WP,NP,!WOW,!GE,KE,OF)
    case ctrl('J'):						// Ctrl-J (literal Line Feed/Enter) (Standard)
    case ctrl('L'):						// Ctrl-L (literal Form Feed)       (Standard)
    case ctrl('M'):						// Ctrl-M (literal Cr)              (Standard)
      if (readonly()) { fl_beep(); return 1; }
      // insert a few selected control characters literally:
      if (input_type() != FL_FLOAT_INPUT && input_type() != FL_INT_INPUT)
        return replace(position(), mark(), &ascii, 1);
      break;
  }
  
  return 0;		// ignored
}